

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::OPAtomIndexFooter::Dump(OPAtomIndexFooter *this,FILE *stream)

{
  bool bVar1;
  PacketList *pPVar2;
  reference ppIVar3;
  _Self local_28;
  _Self local_20;
  iterator i;
  FILE *stream_local;
  OPAtomIndexFooter *this_local;
  
  i._M_node = (_List_node_base *)stream;
  if (stream == (FILE *)0x0) {
    i._M_node = _stderr;
  }
  Partition::Dump(&this->super_Partition,(FILE *)i._M_node);
  pPVar2 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                     (&(this->super_Partition).m_PacketList);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
       begin(&pPVar2->m_List);
  while( true ) {
    pPVar2 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                       (&(this->super_Partition).m_PacketList);
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
         end(&pPVar2->m_List);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppIVar3 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_20);
    (*((*ppIVar3)->super_KLVPacket)._vptr_KLVPacket[0x11])();
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_20,0);
  }
  return;
}

Assistant:

void
ASDCP::MXF::OPAtomIndexFooter::Dump(FILE* stream)
{
  if ( stream == 0 )
    stream = stderr;

  Partition::Dump(stream);

  std::list<InterchangeObject*>::iterator i = m_PacketList->m_List.begin();
  for ( ; i != m_PacketList->m_List.end(); i++ )
    (*i)->Dump(stream);
}